

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxContext.cpp
# Opt level: O3

void __thiscall sf::priv::GlxContext::createContext(GlxContext *this,GlxContext *shared)

{
  uint *puVar1;
  Display *pDVar2;
  int iVar3;
  uint uVar4;
  Uint32 UVar5;
  undefined8 *puVar6;
  long lVar7;
  ostream *poVar8;
  long lVar9;
  long lVar10;
  GLXContext p_Var11;
  long lVar12;
  char *pcVar13;
  int major;
  int debug;
  int nbConfigs;
  int minor;
  uint fbConfigId;
  int attributes [4];
  int local_11c;
  int local_118;
  Uint32 local_114;
  uint local_110;
  int local_10c;
  GLXContext local_108;
  int local_fc;
  GlxErrorHandler local_f8 [2];
  vector<int,_std::allocator<int>_> local_b8;
  undefined8 local_a0;
  
  UVar5 = (this->super_GlContext).m_settings.attributeFlags;
  if (this->m_pbuffer == 0) {
    iVar3 = XGetWindowAttributes(this->m_display,this->m_window,&local_b8);
    if (iVar3 == 0) {
      poVar8 = err();
      pcVar13 = "Failed to get the window attributes";
      lVar7 = 0x23;
      goto LAB_0014430d;
    }
    local_f8[0].m_previousHandler =
         (_func_int_Display_ptr_XErrorEvent_ptr *)
         CONCAT44(local_f8[0].m_previousHandler._4_4_,*(undefined4 *)(this->m_display + 0xe0));
    local_114 = UVar5;
    local_f8[0].m_display = (Display *)XVisualIDFromVisual(local_a0);
    local_118 = 0;
    lVar7 = XGetVisualInfo(this->m_display,3,local_f8);
  }
  else {
    local_f8[0].m_lock.m_mutex._0_4_ = 0;
    local_114 = UVar5;
    glXQueryDrawable(this->m_display,this->m_pbuffer,0x8013,local_f8);
    local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)CONCAT44((uint)local_f8[0].m_lock.m_mutex,0x8013);
    local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (int *)0x0;
    local_118 = 0;
    puVar6 = (undefined8 *)
             glXChooseFBConfig(this->m_display,*(undefined4 *)(this->m_display + 0xe0),&local_b8,
                               &local_118);
    if (local_118 == 1) {
      lVar7 = glXGetVisualFromFBConfig(this->m_display,*puVar6);
    }
    else {
      lVar7 = 0;
      if (puVar6 == (undefined8 *)0x0) goto LAB_001440d3;
    }
    XFree(puVar6);
  }
LAB_001440d3:
  if (lVar7 == 0) {
    poVar8 = err();
    pcVar13 = "Failed to get visual info";
    lVar7 = 0x19;
LAB_0014430d:
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar13,lVar7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    return;
  }
  if (shared == (GlxContext *)0x0) {
    p_Var11 = (GLXContext)0x0;
  }
  else {
    p_Var11 = shared->m_context;
  }
  local_118 = 0;
  local_fc = 0;
  iVar3 = glXQueryVersion(this->m_display);
  if (iVar3 == 0) {
    poVar8 = err();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"Failed to query GLX version, limited to legacy context creation",0x3f);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  if ((sfglx_ext_ARB_create_context == 1) && ((1 < local_118 || (2 < local_fc)))) {
    local_10c = 0;
    local_108 = p_Var11;
    lVar9 = glXChooseFBConfig(this->m_display,*(undefined4 *)(this->m_display + 0xe0),0);
    if ((lVar9 != 0) && (0 < local_10c)) {
      lVar12 = 0;
LAB_001441b4:
      lVar10 = glXGetVisualFromFBConfig(this->m_display);
      if (lVar10 == 0) goto LAB_001441dc;
      if (*(long *)(lVar10 + 8) != *(long *)(lVar7 + 8)) {
        XFree(lVar10);
        goto LAB_001441dc;
      }
      XFree(lVar10);
      while ((this->m_context == (GLXContext)0x0 &&
             (uVar4 = (this->super_GlContext).m_settings.majorVersion, uVar4 != 0))) {
        local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (int *)0x0;
        local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (int *)0x0;
        local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (int *)0x0;
        if ((uVar4 != 1) || (1 < (this->super_GlContext).m_settings.minorVersion)) {
          local_f8[0].m_lock.m_mutex._0_4_ = 0x2091;
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_b8,(iterator)0x0,(int *)local_f8);
          local_f8[0].m_lock.m_mutex._0_4_ = (this->super_GlContext).m_settings.majorVersion;
          if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish ==
              local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_b8,
                       (iterator)
                       local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)local_f8);
          }
          else {
            *local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = (uint)local_f8[0].m_lock.m_mutex;
            local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          local_f8[0].m_lock.m_mutex._0_4_ = 0x2092;
          if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish ==
              local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_b8,
                       (iterator)
                       local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)local_f8);
          }
          else {
            *local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = 0x2092;
            local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          local_f8[0].m_lock.m_mutex._0_4_ = (this->super_GlContext).m_settings.minorVersion;
          if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish ==
              local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_b8,
                       (iterator)
                       local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)local_f8);
          }
          else {
            *local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = (uint)local_f8[0].m_lock.m_mutex;
            local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
        }
        if (sfglx_ext_ARB_create_context_profile == 1) {
          uVar4 = (this->super_GlContext).m_settings.attributeFlags;
          local_f8[0].m_lock.m_mutex._0_4_ = 2 - (uVar4 & 1);
          local_110 = uVar4 >> 2 & 1;
          local_11c = 0x9126;
          if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish ==
              local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_b8,
                       (iterator)
                       local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_11c);
          }
          else {
            *local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = 0x9126;
            local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish ==
              local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_b8,
                       (iterator)
                       local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)local_f8);
          }
          else {
            *local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = (uint)local_f8[0].m_lock.m_mutex;
            local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          local_11c = 0x2094;
          if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish ==
              local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_b8,
                       (iterator)
                       local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_11c);
          }
          else {
            *local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = 0x2094;
            local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish ==
              local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_b8,
                       (iterator)
                       local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)&local_110);
          }
          else {
            *local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = local_110;
            local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          if (((this->super_GlContext).m_settings.attributeFlags & 5) != 0) {
            poVar8 = err();
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,"Selecting a profile during context creation is not supported,",0x3d);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,"disabling comptibility and debug",0x20);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
          }
          (this->super_GlContext).m_settings.attributeFlags = 0;
        }
        local_f8[0].m_lock.m_mutex._0_4_ = 0;
        if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_b8,
                     (iterator)
                     local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)local_f8);
        }
        else {
          *local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = 0;
          local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        local_f8[0].m_lock.m_mutex._0_4_ = 0;
        if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_b8,
                     (iterator)
                     local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)local_f8);
        }
        else {
          *local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = 0;
          local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        pDVar2 = this->m_display;
        Lock::Lock(&local_f8[0].m_lock,(Mutex *)&(anonymous_namespace)::glxErrorMutex);
        local_f8[0].m_display = pDVar2;
        local_f8[0].m_previousHandler =
             (_func_int_Display_ptr_XErrorEvent_ptr *)
             XSetErrorHandler(anon_unknown.dwarf_10e551::HandleXError);
        if ((local_108 != (GLXContext)0x0) &&
           (iVar3 = glXMakeCurrent(this->m_display,0,0), iVar3 == 0)) {
          poVar8 = err();
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"Failed to deactivate shared context before sharing",0x32);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          anon_unknown.dwarf_10e551::GlxErrorHandler::~GlxErrorHandler(local_f8);
          if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start == (int *)0x0) {
            return;
          }
          operator_delete(local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
          return;
        }
        p_Var11 = (*sf_ptrc_glXCreateContextAttribsARB)
                            (this->m_display,*(GLXFBConfig *)(lVar9 + lVar12 * 8),local_108,1,
                             local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start);
        this->m_context = p_Var11;
        if (p_Var11 == (GLXContext)0x0) {
          UVar5 = 0;
          if ((this->super_GlContext).m_settings.attributeFlags == 0) {
            uVar4 = (this->super_GlContext).m_settings.minorVersion;
            if (uVar4 == 0) {
              puVar1 = &(this->super_GlContext).m_settings.majorVersion;
              *puVar1 = *puVar1 - 1;
              uVar4 = 9;
            }
            else {
              uVar4 = uVar4 - 1;
            }
            (this->super_GlContext).m_settings.minorVersion = uVar4;
            UVar5 = local_114;
          }
          (this->super_GlContext).m_settings.attributeFlags = UVar5;
        }
        anon_unknown.dwarf_10e551::GlxErrorHandler::~GlxErrorHandler(local_f8);
        if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (int *)0x0) {
          operator_delete(local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
      }
      goto LAB_00144232;
    }
LAB_001441e9:
    poVar8 = err();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"Failed to get GLXFBConfig which corresponds to the window\'s visual",0x42);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    p_Var11 = local_108;
    if (lVar9 != 0) {
LAB_00144232:
      XFree(lVar9);
      p_Var11 = local_108;
    }
  }
  if (this->m_context == (GLXContext)0x0) {
    (this->super_GlContext).m_settings.majorVersion = 2;
    (this->super_GlContext).m_settings.minorVersion = 1;
    (this->super_GlContext).m_settings.attributeFlags = 0;
    if ((p_Var11 != (GLXContext)0x0) && (iVar3 = glXMakeCurrent(this->m_display,0,0), iVar3 == 0)) {
      poVar8 = err();
      pcVar13 = "Failed to deactivate shared context before sharing";
      lVar7 = 0x32;
      goto LAB_0014430d;
    }
    p_Var11 = (GLXContext)glXCreateContext(this->m_display,lVar7,p_Var11,1);
    this->m_context = p_Var11;
    if (p_Var11 == (GLXContext)0x0) {
      poVar8 = err();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"Failed to create an OpenGL context for this window",0x32);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
    }
  }
  XFree(lVar7);
  return;
LAB_001441dc:
  lVar12 = lVar12 + 1;
  if (local_10c <= lVar12) goto LAB_001441e9;
  goto LAB_001441b4;
}

Assistant:

void GlxContext::createContext(GlxContext* shared)
{
    // Get a working copy of the context settings
    ContextSettings settings = m_settings;

    XVisualInfo* visualInfo = NULL;

    if (m_pbuffer)
    {
        unsigned int fbConfigId = 0;

        glXQueryDrawable(m_display, m_pbuffer, GLX_FBCONFIG_ID, &fbConfigId);

        int attributes[] =
        {
            GLX_FBCONFIG_ID, static_cast<int>(fbConfigId),
            0,               0
        };

        int count = 0;
        GLXFBConfig* fbconfig = glXChooseFBConfig(m_display, DefaultScreen(m_display), attributes, &count);

        if (count == 1)
            visualInfo = glXGetVisualFromFBConfig(m_display, *fbconfig);

        if (fbconfig)
            XFree(fbconfig);
    }
    else
    {
        // Retrieve the attributes of the target window
        XWindowAttributes windowAttributes;
        if (XGetWindowAttributes(m_display, m_window, &windowAttributes) == 0)
        {
            err() << "Failed to get the window attributes" << std::endl;
            return;
        }

        // Get its visuals
        XVisualInfo tpl;
        tpl.screen   = DefaultScreen(m_display);
        tpl.visualid = XVisualIDFromVisual(windowAttributes.visual);
        int nbVisuals = 0;
        visualInfo = XGetVisualInfo(m_display, VisualIDMask | VisualScreenMask, &tpl, &nbVisuals);
    }

    if (!visualInfo)
    {
        err() << "Failed to get visual info" << std::endl;
        return;
    }

    // Get the context to share display lists with
    GLXContext toShare = shared ? shared->m_context : NULL;

    // There are no GLX versions prior to 1.0
    int major = 0;
    int minor = 0;

    if (!glXQueryVersion(m_display, &major, &minor))
        err() << "Failed to query GLX version, limited to legacy context creation" << std::endl;

    // Check if glXCreateContextAttribsARB is available (requires GLX 1.3 or greater)
    bool hasCreateContextArb = (sfglx_ext_ARB_create_context == sfglx_LOAD_SUCCEEDED) && ((major > 1) || (minor >= 3));

    // Create the OpenGL context -- first try using glXCreateContextAttribsARB
    if (hasCreateContextArb)
    {
        // Get a GLXFBConfig that matches the window's visual, for glXCreateContextAttribsARB
        GLXFBConfig* config = NULL;

        // We don't supply attributes to match against, since
        // the visual we are matching against was already
        // deemed suitable in selectBestVisual()
        int nbConfigs = 0;
        GLXFBConfig* configs = glXChooseFBConfig(m_display, DefaultScreen(m_display), NULL, &nbConfigs);

        for (int i = 0; configs && (i < nbConfigs); ++i)
        {
            XVisualInfo* visual = glXGetVisualFromFBConfig(m_display, configs[i]);

            if (!visual)
                continue;

            if (visual->visualid == visualInfo->visualid)
            {
                config = &configs[i];
                XFree(visual);
                break;
            }

            XFree(visual);
        }

        if (!config)
            err() << "Failed to get GLXFBConfig which corresponds to the window's visual" << std::endl;

        while (config && !m_context && m_settings.majorVersion)
        {
            std::vector<int> attributes;

            // Check if the user requested a specific context version (anything > 1.1)
            if ((m_settings.majorVersion > 1) || ((m_settings.majorVersion == 1) && (m_settings.minorVersion > 1)))
            {
                attributes.push_back(GLX_CONTEXT_MAJOR_VERSION_ARB);
                attributes.push_back(m_settings.majorVersion);
                attributes.push_back(GLX_CONTEXT_MINOR_VERSION_ARB);
                attributes.push_back(m_settings.minorVersion);
            }

            // Check if setting the profile is supported
            if (sfglx_ext_ARB_create_context_profile == sfglx_LOAD_SUCCEEDED)
            {
                int profile = (m_settings.attributeFlags & ContextSettings::Core) ? GLX_CONTEXT_CORE_PROFILE_BIT_ARB : GLX_CONTEXT_COMPATIBILITY_PROFILE_BIT_ARB;
                int debug = (m_settings.attributeFlags & ContextSettings::Debug) ? GLX_CONTEXT_DEBUG_BIT_ARB : 0;

                attributes.push_back(GLX_CONTEXT_PROFILE_MASK_ARB);
                attributes.push_back(profile);
                attributes.push_back(GLX_CONTEXT_FLAGS_ARB);
                attributes.push_back(debug);
            }
            else
            {
                if ((m_settings.attributeFlags & ContextSettings::Core) || (m_settings.attributeFlags & ContextSettings::Debug))
                    err() << "Selecting a profile during context creation is not supported,"
                          << "disabling comptibility and debug" << std::endl;

                m_settings.attributeFlags = ContextSettings::Default;
            }

            // Append the terminating 0
            attributes.push_back(0);
            attributes.push_back(0);

            // RAII GLX error handler (we simply ignore errors here)
            // On an error, glXCreateContextAttribsARB will return 0 anyway
            GlxErrorHandler handler(m_display);

            if (toShare)
            {
                if (!glXMakeCurrent(m_display, None, NULL))
                {
                    err() << "Failed to deactivate shared context before sharing" << std::endl;
                    return;
                }
            }

            // Create the context
            m_context = glXCreateContextAttribsARB(m_display, *config, toShare, true, &attributes[0]);

            if (!m_context)
            {
                // If we couldn't create the context, first try disabling flags,
                // then lower the version number and try again -- stop at 0.0
                // Invalid version numbers will be generated by this algorithm (like 3.9), but we really don't care
                if (m_settings.attributeFlags != ContextSettings::Default)
                {
                    m_settings.attributeFlags = ContextSettings::Default;
                }
                else if (m_settings.minorVersion > 0)
                {
                    // If the minor version is not 0, we decrease it and try again
                    m_settings.minorVersion--;

                    m_settings.attributeFlags = settings.attributeFlags;
                }
                else
                {
                    // If the minor version is 0, we decrease the major version
                    m_settings.majorVersion--;
                    m_settings.minorVersion = 9;

                    m_settings.attributeFlags = settings.attributeFlags;
                }
            }
        }

        if (configs)
            XFree(configs);
    }

    // If glXCreateContextAttribsARB failed, use glXCreateContext
    if (!m_context)
    {
        // set the context version to 2.1 (arbitrary) and disable flags
        m_settings.majorVersion = 2;
        m_settings.minorVersion = 1;
        m_settings.attributeFlags = ContextSettings::Default;

#if defined(GLX_DEBUGGING)
    GlxErrorHandler handler(m_display);
#endif

        if (toShare)
        {
            if (!glXMakeCurrent(m_display, None, NULL))
            {
                err() << "Failed to deactivate shared context before sharing" << std::endl;
                return;
            }
        }

        // Create the context, using the target window's visual
        m_context = glXCreateContext(m_display, visualInfo, toShare, true);

#if defined(GLX_DEBUGGING)
    if (glxErrorOccurred)
        err() << "GLX error in GlxContext::createContext()" << std::endl;
#endif
    }

    if (!m_context)
        err() << "Failed to create an OpenGL context for this window" << std::endl;

    // Free the visual info
    XFree(visualInfo);
}